

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O2

int run_test_fs_event_watch_file_twice(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  char path [25];
  uv_timer_t timer;
  uv_fs_event_t watchers [2];
  
  builtin_strncpy(path + 0x10,"pty_file",9);
  builtin_strncpy(path,"test/fixtures/em",0x10);
  loop = (uv_loop_t *)uv_default_loop();
  timer.data = watchers;
  iVar1 = uv_fs_event_init(loop);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    iVar1 = uv_fs_event_start(watchers,fail_cb,path,0);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      iVar1 = uv_fs_event_init(loop,watchers + 1);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        iVar1 = uv_fs_event_start(watchers + 1,fail_cb,path,0);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          iVar1 = uv_timer_init(loop,&timer);
          eval_a = (int64_t)iVar1;
          eval_b = 0;
          if (eval_a == 0) {
            iVar1 = uv_timer_start(&timer,timer_cb_watch_twice,10,0);
            eval_a = (int64_t)iVar1;
            eval_b = 0;
            if (eval_a == 0) {
              iVar1 = uv_run(loop,0);
              eval_a = (int64_t)iVar1;
              eval_b = 0;
              if (eval_a == 0) {
                close_loop(loop);
                eval_a = 0;
                iVar1 = uv_loop_close(loop);
                eval_b = (int64_t)iVar1;
                if (eval_b == 0) {
                  uv_library_shutdown();
                  return 0;
                }
                pcVar4 = "uv_loop_close(loop)";
                pcVar3 = "0";
                uVar2 = 0x2a6;
              }
              else {
                pcVar4 = "0";
                pcVar3 = "uv_run(loop, UV_RUN_DEFAULT)";
                uVar2 = 0x2a4;
              }
            }
            else {
              pcVar4 = "0";
              pcVar3 = "uv_timer_start(&timer, timer_cb_watch_twice, 10, 0)";
              uVar2 = 0x2a3;
            }
          }
          else {
            pcVar4 = "0";
            pcVar3 = "uv_timer_init(loop, &timer)";
            uVar2 = 0x2a2;
          }
        }
        else {
          pcVar4 = "0";
          pcVar3 = "uv_fs_event_start(watchers + 1, fail_cb, path, 0)";
          uVar2 = 0x2a1;
        }
      }
      else {
        pcVar4 = "0";
        pcVar3 = "uv_fs_event_init(loop, watchers + 1)";
        uVar2 = 0x2a0;
      }
    }
    else {
      pcVar4 = "0";
      pcVar3 = "uv_fs_event_start(watchers + 0, fail_cb, path, 0)";
      uVar2 = 0x29f;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "uv_fs_event_init(loop, watchers + 0)";
    uVar2 = 0x29e;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(fs_event_watch_file_twice) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif
  const char path[] = "test/fixtures/empty_file";
  uv_fs_event_t watchers[2];
  uv_timer_t timer;
  uv_loop_t* loop;

  loop = uv_default_loop();
  timer.data = watchers;

  ASSERT_OK(uv_fs_event_init(loop, watchers + 0));
  ASSERT_OK(uv_fs_event_start(watchers + 0, fail_cb, path, 0));
  ASSERT_OK(uv_fs_event_init(loop, watchers + 1));
  ASSERT_OK(uv_fs_event_start(watchers + 1, fail_cb, path, 0));
  ASSERT_OK(uv_timer_init(loop, &timer));
  ASSERT_OK(uv_timer_start(&timer, timer_cb_watch_twice, 10, 0));
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}